

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_sid.cpp
# Opt level: O2

string * __thiscall
cppcms::sessions::session_sid::get_new_sid_abi_cxx11_
          (string *__return_storage_ptr__,session_sid *this)

{
  allocator local_51;
  urandom_device rnd;
  char sid [16];
  char res [33];
  
  urandom_device::urandom_device(&rnd);
  urandom_device::generate(&rnd,sid,0x10);
  cppcms::impl::tohex(sid,0x10,res);
  std::__cxx11::string::string((string *)__return_storage_ptr__,res,&local_51);
  urandom_device::~urandom_device(&rnd);
  return __return_storage_ptr__;
}

Assistant:

std::string session_sid::get_new_sid()
{
	char sid[16];			
	char res[33];
	urandom_device rnd;
	rnd.generate(sid,sizeof(sid));
	cppcms::impl::tohex(sid,sizeof(sid),res);
	return res;
}